

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O3

ssize_t __thiscall stk::FileWrite::write(FileWrite *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  long lVar2;
  StkFormat SVar3;
  undefined8 in_RAX;
  size_t sVar4;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  FILE *__s;
  Type type;
  undefined4 in_register_00000034;
  long *plVar5;
  undefined8 *__ptr;
  long lVar6;
  SINT16 sample;
  undefined8 local_38;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  if (this->fd_ == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,
               "FileWrite::write(): a file has not yet been opened!",0x33);
    type = WARNING;
  }
  else {
    if (*(uint *)(plVar5 + 3) == this->channels_) {
      lVar2 = plVar5[4];
      SVar3 = this->dataType_;
      local_38 = in_RAX;
      if (SVar3 == 2) {
        if (lVar2 != 0) {
          lVar6 = 0;
          do {
            local_38 = CONCAT62(local_38._2_6_,
                                (short)(int)(*(double *)(*plVar5 + lVar6 * 8) * 32767.0));
            if (this->byteswap_ == true) {
              Stk::swap16((uchar *)&local_38);
            }
            sVar4 = fwrite(&local_38,2,1,(FILE *)this->fd_);
            if (sVar4 != 1) {
LAB_00110548:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&Stk::oStream__abi_cxx11_,
                         "FileWrite::write(): error writing data to file!",0x2f);
              Stk::handleError(&this->super_Stk,FILE_ERROR);
              return extraout_RAX_00;
            }
            lVar6 = lVar6 + 1;
          } while (lVar2 != lVar6);
        }
      }
      else if (SVar3 == 1) {
        if (this->fileType_ == 2) {
          if (lVar2 != 0) {
            lVar6 = 0;
            do {
              local_38 = CONCAT71(local_38._1_7_,
                                  (char)(int)(*(double *)(*plVar5 + lVar6 * 8) * 127.0 + 128.0));
              sVar4 = fwrite(&local_38,1,1,(FILE *)this->fd_);
              if (sVar4 != 1) goto LAB_00110548;
              lVar6 = lVar6 + 1;
            } while (lVar2 != lVar6);
          }
        }
        else if (lVar2 != 0) {
          lVar6 = 0;
          do {
            local_38 = CONCAT71(local_38._1_7_,(char)(int)(*(double *)(*plVar5 + lVar6 * 8) * 127.0)
                               );
            sVar4 = fwrite(&local_38,1,1,(FILE *)this->fd_);
            if (sVar4 != 1) goto LAB_00110548;
            lVar6 = lVar6 + 1;
          } while (lVar2 != lVar6);
        }
      }
      else if (SVar3 == 8) {
        if (lVar2 != 0) {
          lVar6 = 0;
          do {
            local_38 = CONCAT44(local_38._4_4_,
                                (int)(*(double *)(*plVar5 + lVar6 * 8) * 2147483647.0));
            if (this->byteswap_ == true) {
              Stk::swap32((uchar *)&local_38);
            }
            sVar4 = fwrite(&local_38,4,1,(FILE *)this->fd_);
            if (sVar4 != 1) goto LAB_00110548;
            lVar6 = lVar6 + 1;
          } while (lVar2 != lVar6);
        }
      }
      else if (SVar3 == 0x10) {
        if (lVar2 != 0) {
          lVar6 = 0;
          do {
            local_38 = CONCAT44(local_38._4_4_,(float)*(double *)(*plVar5 + lVar6 * 8));
            if (this->byteswap_ == true) {
              Stk::swap32((uchar *)&local_38);
            }
            sVar4 = fwrite(&local_38,4,1,(FILE *)this->fd_);
            if (sVar4 != 1) goto LAB_00110548;
            lVar6 = lVar6 + 1;
          } while (lVar2 != lVar6);
        }
      }
      else if (SVar3 == 0x20) {
        if (lVar2 != 0) {
          lVar6 = 0;
          do {
            local_38 = *(undefined8 *)(*plVar5 + lVar6 * 8);
            if (this->byteswap_ == true) {
              Stk::swap64((uchar *)&local_38);
            }
            sVar4 = fwrite(&local_38,8,1,(FILE *)this->fd_);
            if (sVar4 != 1) goto LAB_00110548;
            lVar6 = lVar6 + 1;
          } while (lVar2 != lVar6);
        }
      }
      else if ((SVar3 == 4) && (lVar2 != 0)) {
        lVar6 = 0;
        do {
          local_38 = CONCAT44(local_38._4_4_,(int)(*(double *)(*plVar5 + lVar6 * 8) * 8388607.0));
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&local_38);
            __s = (FILE *)this->fd_;
            __ptr = (undefined8 *)((long)&local_38 + 1);
          }
          else {
            __s = (FILE *)this->fd_;
            __ptr = &local_38;
          }
          sVar4 = fwrite(__ptr,3,1,__s);
          if (sVar4 != 1) goto LAB_00110548;
          lVar6 = lVar6 + 1;
        } while (lVar2 != lVar6);
      }
      uVar1 = *(uint *)(plVar5 + 2);
      this->frameCounter_ = this->frameCounter_ + (ulong)uVar1;
      return (ulong)uVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,
               "FileWrite::write(): number of channels in the StkFrames argument does not match that specified to open() function!"
               ,0x72);
    type = FUNCTION_ARGUMENT;
  }
  Stk::handleError(&this->super_Stk,type);
  return extraout_RAX;
}

Assistant:

void FileWrite :: write( StkFrames& buffer )
{
  if ( fd_ == 0 ) {
    oStream_ << "FileWrite::write(): a file has not yet been opened!";
    handleError( StkError::WARNING );
    return;
  }

  if ( buffer.channels() != channels_ ) {
    oStream_ << "FileWrite::write(): number of channels in the StkFrames argument does not match that specified to open() function!";
    handleError( StkError::FUNCTION_ARGUMENT );
    return;
  }

  unsigned long nSamples = buffer.size();
  if ( dataType_ == STK_SINT16 ) {
    SINT16 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT16) (buffer[k] * 32767.0);
      //sample = ((SINT16) (( buffer[k] + 1.0 ) * 32767.5 + 0.5)) - 32768;
      if ( byteswap_ ) swap16( (unsigned char *)&sample );
      if ( fwrite(&sample, 2, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_SINT8 ) {
    if ( fileType_ == FILE_WAV ) { // 8-bit WAV data is unsigned!
      unsigned char sample;
      for ( unsigned long k=0; k<nSamples; k++ ) {
        sample = (unsigned char) (buffer[k] * 127.0 + 128.0);
        if ( fwrite(&sample, 1, 1, fd_) != 1 ) goto error;
      }
    }
    else {
      signed char sample;
      for ( unsigned long k=0; k<nSamples; k++ ) {
        sample = (signed char) (buffer[k] * 127.0);
        //sample = ((signed char) (( buffer[k] + 1.0 ) * 127.5 + 0.5)) - 128;
        if ( fwrite(&sample, 1, 1, fd_) != 1 ) goto error;
      }
    }
  }
  else if ( dataType_ == STK_SINT32 ) {
    SINT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT32) (buffer[k] * 2147483647.0);
      //sample = ((SINT32) (( buffer[k] + 1.0 ) * 2147483647.5 + 0.5)) - 2147483648;
      if ( byteswap_ ) swap32( (unsigned char *)&sample );
      if ( fwrite(&sample, 4, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_FLOAT32 ) {
    FLOAT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (FLOAT32) (buffer[k]);
      if ( byteswap_ ) swap32( (unsigned char *)&sample );
      if ( fwrite(&sample, 4, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    FLOAT64 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (FLOAT64) (buffer[k]);
      if ( byteswap_ ) swap64( (unsigned char *)&sample );
      if ( fwrite(&sample, 8, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_SINT24 ) {
    SINT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT32) (buffer[k] * 8388607.0);
      if ( byteswap_ ) {
        swap32( (unsigned char *)&sample );
        unsigned char *ptr = (unsigned char *) &sample;
        if ( fwrite(ptr+1, 3, 1, fd_) != 1 ) goto error;
      }
      else
        if ( fwrite(&sample, 3, 1, fd_) != 1 ) goto error;
    }
  }

  frameCounter_ += buffer.frames();
  return;

 error:
  oStream_ << "FileWrite::write(): error writing data to file!";
  handleError( StkError::FILE_ERROR );
}